

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Command * Interpreter::RunInterpreter(InterpreterContext *context,const_iterator *itr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  int iVar3;
  Command *pCVar4;
  runtime_error *prVar5;
  InterpreterContext *context_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parameters;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  iVar3 = std::__cxx11::string::compare((char *)itr->_M_current);
  if (iVar3 == 0) {
    return (Command *)0x0;
  }
  while (pbVar1 = itr->_M_current, *(pbVar1->_M_dataplus)._M_p == '#') {
    itr->_M_current = pbVar1 + 1;
    iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
    if (iVar3 == 0) {
      return (Command *)0x0;
    }
  }
  itr->_M_current = pbVar1 + 1;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)itr->_M_current);
  if (iVar3 == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"unexpected end of file");
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)itr->_M_current);
    if (iVar3 == 0) {
      pbVar1 = itr->_M_current;
      itr->_M_current = pbVar1 + 1;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
      while ((iVar3 != 0 &&
             (iVar3 = std::__cxx11::string::compare((char *)itr->_M_current), iVar3 != 0))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_68,itr->_M_current);
        pbVar1 = itr->_M_current;
        itr->_M_current = pbVar1 + 1;
        iVar3 = std::__cxx11::string::compare((char *)(pbVar1 + 1));
      }
      context_00 = (InterpreterContext *)itr->_M_current;
      iVar3 = std::__cxx11::string::compare((char *)context_00);
      if (iVar3 != 0) {
        itr->_M_current = itr->_M_current + 1;
        pCVar4 = ConstructCommand(context_00,&local_50,&local_68);
        if (pCVar4 != (Command *)0x0) {
          (*pCVar4->_vptr_Command[2])(pCVar4,context,itr);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return pCVar4;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"unexpected end of file");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Invalid token, i am looking for \'(\'");
  }
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Command* Interpreter::RunInterpreter(InterpreterContext& context, std::vector<std::string>::const_iterator& itr)
{
    Command* result = nullptr;

    if (*itr != "")
    {
        while ((*itr)[0] == '#')
        {
            ++itr;
            if (*itr == "") return result;
        }

        // we assume everything is a command
        std::string command = *itr++;

        if (*itr == "")
        {
            throw std::runtime_error("unexpected end of file");
        }
        else if (*itr != "(")
        {
            throw std::runtime_error("Invalid token, i am looking for '('");
        }

        ++itr;  // skip (

        // grab all parameters until the next )
        std::vector<std::string> parameters;
        while (*itr != "" && *itr != ")")
        {
            parameters.push_back(*itr);
            ++itr;
        }
        if (*itr == "") throw std::runtime_error("unexpected end of file");

        ++itr;  // skip )

        auto i = Interpreter::ConstructCommand(context, command, parameters);
        if (i != nullptr)
        {
            i->Run(context, itr);
            result = i;
        }
    }

    return result;
}